

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_grid.c
# Opt level: O3

REF_STATUS ref_grid_tattle(REF_GRID ref_grid,REF_INT node)

{
  REF_GEOM ref_geom;
  uint uVar1;
  undefined8 uVar2;
  char *pcVar3;
  long lVar4;
  
  ref_geom = ref_grid->geom;
  uVar1 = ref_node_location(ref_grid->node,node);
  if (uVar1 == 0) {
    uVar1 = ref_geom_tattle(ref_geom,node);
    if (uVar1 == 0) {
      lVar4 = 0;
      while (uVar1 = ref_cell_tattle_about(ref_grid->cell[lVar4],node), uVar1 == 0) {
        lVar4 = lVar4 + 1;
        if (lVar4 == 0x10) {
          return 0;
        }
      }
      pcVar3 = "cell tatt";
      uVar2 = 0x113;
    }
    else {
      pcVar3 = "geom tatt";
      uVar2 = 0x111;
    }
  }
  else {
    pcVar3 = "loc";
    uVar2 = 0x110;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",uVar2,
         "ref_grid_tattle",(ulong)uVar1,pcVar3);
  return uVar1;
}

Assistant:

REF_FCN REF_STATUS ref_grid_tattle(REF_GRID ref_grid, REF_INT node) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_CELL ref_cell;
  REF_INT group;
  RSS(ref_node_location(ref_node, node), "loc");
  RSS(ref_geom_tattle(ref_geom, node), "geom tatt");
  each_ref_grid_all_ref_cell(ref_grid, group, ref_cell) {
    RSS(ref_cell_tattle_about(ref_cell, node), "cell tatt");
  }
  return REF_SUCCESS;
}